

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 FixLargeWindowsWhenUndocking(ImVec2 *size,ImGuiViewport *ref_viewport)

{
  ImVec2 local_50;
  ImVec2 local_48;
  ImGuiPlatformMonitor *local_40;
  ImGuiPlatformMonitor *monitor;
  ImVec2 local_30;
  ImVec2 max_size;
  ImGuiContext_conflict *g;
  ImGuiViewport *ref_viewport_local;
  ImVec2 *size_local;
  
  if (ref_viewport == (ImGuiViewport *)0x0) {
    size_local = *(ImVec2 **)size;
  }
  else {
    max_size = (ImVec2)GImGui;
    monitor = (ImGuiPlatformMonitor *)operator*(&ref_viewport->WorkSize,0.9);
    local_30 = ImFloor((ImVec2 *)&monitor);
    if ((*(uint *)((long)max_size + 0x1a78) & 0x400) != 0) {
      local_40 = ImGui::GetViewportPlatformMonitor(ref_viewport);
      local_50 = operator*(&local_40->WorkSize,0.9);
      local_48 = ImFloor(&local_50);
      local_30 = local_48;
    }
    size_local = (ImVec2 *)ImMin(size,&local_30);
  }
  return (ImVec2)size_local;
}

Assistant:

static ImVec2 FixLargeWindowsWhenUndocking(const ImVec2& size, ImGuiViewport* ref_viewport)
{
    if (ref_viewport == NULL)
        return size;

    ImGuiContext& g = *GImGui;
    ImVec2 max_size = ImFloor(ref_viewport->WorkSize * 0.90f);
    if (g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable)
    {
        const ImGuiPlatformMonitor* monitor = ImGui::GetViewportPlatformMonitor(ref_viewport);
        max_size = ImFloor(monitor->WorkSize * 0.90f);
    }
    return ImMin(size, max_size);
}